

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

void reloc_hunk(GlobalVars *gv,FILE *f,LinkedSection *sec,uint32_t relhunk,uint8_t rtype,
               uint16_t rsize)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *__ptr;
  list *l;
  node *pnVar5;
  node *pnVar6;
  node *pnVar7;
  bool bVar8;
  uint32_t uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  pnVar5 = (sec->relocs).first;
  pvVar4 = alloc((long)gv->nsecs << 3);
  __ptr = alloczero((long)gv->nsecs << 2);
  if (0 < gv->nsecs) {
    lVar10 = 0;
    do {
      l = (list *)alloc(0x18);
      *(list **)((long)pvVar4 + lVar10 * 8) = l;
      initlist(l);
      lVar10 = lVar10 + 1;
    } while (lVar10 < gv->nsecs);
  }
  if (rsize == 0x18) {
    uVar12 = 6;
    uVar13 = 0x3ffffff;
    uVar11 = 0x3fffffc;
  }
  else if (rsize == 0xe) {
    uVar12 = 0x10;
    uVar11 = 0xfffc;
    uVar13 = 0xffff;
  }
  else {
    uVar11 = ~(-1L << ((byte)rsize & 0x3f));
    uVar12 = 0;
    uVar13 = uVar11;
  }
  pnVar7 = pnVar5->next;
  if (pnVar7 == (node *)0x0) {
LAB_00118820:
    iVar3 = gv->nsecs;
  }
  else {
    bVar14 = true;
    bVar8 = true;
    do {
      while ((((pnVar6 = pnVar7, *(uint8_t *)&pnVar5[3].pred == rtype &&
               (pnVar7 = pnVar5[3].next, pnVar7 != (node *)0x0)) &&
              (uVar12 == *(ushort *)&pnVar7->pred)) &&
             ((*(uint16_t *)((long)&pnVar7->pred + 2) == rsize &&
              (((ulong)pnVar7[1].next & uVar13) == uVar11))))) {
        remnode(pnVar5);
        addtail(*(list **)((long)pvVar4 + (long)*(int *)&pnVar5[1].pred[1].next * 8),pnVar5);
        pnVar7 = (node *)((long)&(pnVar5[2].next)->next + (ulong)(uVar12 >> 3));
        pnVar5[2].next = pnVar7;
        lVar10 = (long)*(int *)&pnVar5[1].pred[1].next;
        iVar3 = *(int *)((long)__ptr + lVar10 * 4);
        *(int *)((long)__ptr + lVar10 * 4) = iVar3 + 1;
        bVar14 = false;
        if ((node *)0xffff < pnVar7) {
          bVar8 = false;
        }
        if (0xfffe < iVar3) {
          bVar8 = false;
        }
        pnVar7 = pnVar6->next;
        pnVar5 = pnVar6;
        if (pnVar6->next == (node *)0x0) goto LAB_001186ae;
      }
      pnVar7 = pnVar6->next;
      pnVar5 = pnVar6;
    } while (pnVar6->next != (node *)0x0);
    if (bVar14) goto LAB_00118820;
LAB_001186ae:
    if (relhunk == 0x3ec) {
      if ((gv->reloctab_format != '\x04') || (!bVar8)) goto LAB_00118798;
      bVar14 = gv->dest_object == 0;
LAB_001186df:
      uVar9 = 0x3f7;
      if (!bVar14) {
        uVar9 = relhunk;
      }
      if (relhunk != 0x3ec) {
        uVar9 = relhunk;
      }
      fwrite32be(f,uVar9);
      if (0 < gv->nsecs) {
        lVar10 = 0;
        bVar8 = false;
        do {
          iVar3 = *(int *)((long)__ptr + lVar10 * 4);
          if (iVar3 != 0) {
            fwrite16be(f,(uint16_t)iVar3);
            fwrite16be(f,(uint16_t)lVar10);
            while (pnVar5 = remhead(*(list **)((long)pvVar4 + lVar10 * 8)), pnVar5 != (node *)0x0) {
              fwrite16be(f,*(uint16_t *)&pnVar5[2].next);
              bVar8 = (bool)(bVar8 ^ 1);
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < gv->nsecs);
        if (bVar8) {
          fwrite16be(f,0);
          goto LAB_00118820;
        }
      }
LAB_00118816:
      fwrite32be(f,0);
      goto LAB_00118820;
    }
    if ((relhunk != 0x3fd) || (gv->dest_object != 0)) {
LAB_00118798:
      fwrite32be(f,relhunk);
      iVar3 = gv->nsecs;
      if (0 < iVar3) {
        lVar10 = 0;
        do {
          uVar9 = *(uint32_t *)((long)__ptr + lVar10 * 4);
          if (uVar9 != 0) {
            do {
              if (0xffff < (int)uVar9) {
                uVar9 = 0x10000;
              }
              fwrite32be(f,uVar9);
              fwrite32be(f,(uint32_t)lVar10);
              piVar2 = (int *)((long)__ptr + lVar10 * 4);
              *piVar2 = *piVar2 - uVar9;
              do {
                pnVar5 = remhead(*(list **)((long)pvVar4 + lVar10 * 8));
                if (pnVar5 != (node *)0x0) {
                  fwrite32be(f,*(uint32_t *)&pnVar5[2].next);
                }
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
              uVar9 = *(uint32_t *)((long)__ptr + lVar10 * 4);
            } while (uVar9 != 0);
            iVar3 = gv->nsecs;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar3);
      }
      goto LAB_00118816;
    }
    bVar14 = true;
    if (bVar8) goto LAB_001186df;
    if (gv->nsecs < 1) goto LAB_0011884a;
    lVar10 = 0;
    do {
      while (pnVar5 = remhead(*(list **)((long)pvVar4 + lVar10 * 8)), pnVar5 != (node *)0x0) {
        addtail(&sec->relocs,pnVar5);
      }
      lVar10 = lVar10 + 1;
      iVar3 = gv->nsecs;
    } while (lVar10 < iVar3);
  }
  if (0 < iVar3) {
    lVar10 = 0;
    do {
      lVar1 = lVar10 * 8;
      lVar10 = lVar10 + 1;
      free(*(void **)((long)pvVar4 + lVar1));
    } while (lVar10 < gv->nsecs);
  }
LAB_0011884a:
  free(__ptr);
  return;
}

Assistant:

static void reloc_hunk(struct GlobalVars *gv,FILE *f,
                       struct LinkedSection *sec,uint32_t relhunk,
                       uint8_t rtype,uint16_t rsize)
/* generate an AmigaDOS/EHF relocation hunk for a specific reloc type */
{
  struct Reloc *nextrel,*rel=(struct Reloc *)sec->relocs.first;
  struct list **rlist=alloc(gv->nsecs*sizeof(struct list *));
  int *rcnt=alloczero(gv->nsecs*sizeof(int)); /* reloc cnt for all sect. */
  bool hunk_required=FALSE,small_offsets=TRUE;
  lword chkmask,rmask=makemask(rsize);
  uint16_t rpos=0;
  int i;

  for (i=0; i<gv->nsecs; i++) {  /* empty reloc lists for each section */
    rlist[i] = alloc(sizeof(struct list));
    initlist(rlist[i]);
  }

  /* EHF-PowerPC relocations need special treatment */
  if (rsize == 24) {
    rpos = 6;
    rmask = 0x3ffffff;
    chkmask = 0x3fffffc;
  }
  else if (rsize == 14) {
    rpos = 16;
    rmask = 0xffff;
    chkmask = 0xfffc;
  }
  else
    chkmask = rmask;

  while (nextrel = (struct Reloc *)rel->n.next) {
    struct RelocInsert *ri;
    int newrcnt;

    if (rel->rtype==rtype && (ri=rel->insert)!=NULL) {
      if (ri->bpos==rpos && ri->bsiz==rsize && (ri->mask&rmask)==chkmask) {
        /* move reloc node of correct type into relocssect's rlist */
        remnode(&rel->n);
        addtail(rlist[rel->relocsect.lnk->index],&rel->n);
        rel->offset += rpos >> 3;
        if (++rcnt[rel->relocsect.lnk->index] >= 0x10000 ||
            rel->offset >= 0x10000)
          small_offsets = FALSE; /* no short-reloc hunk would be possible */
        hunk_required = TRUE;
      }
    }
    rel = nextrel;
  }

  if (hunk_required) {  /* there's at least one relocation */

    if ((relhunk==HUNK_ABSRELOC32 &&
         gv->reloctab_format==RTAB_SHORTOFF && small_offsets) ||
        (relhunk==HUNK_RELRELOC32 && !gv->dest_object)) {
      /* Make a short hunk with 16-bit offsets.
         For executables, HUNK_DREL32 is used instead of the correct
         HUNK_RELOC32SHORT to be compatible with OS2.0.
         Due to a bug in OS3.x HUNK_RELRELOC32 requires 16-bit offsets
         in executables. */
      int cnt=0;

      if (!small_offsets) {
        /* cannot represent those relocs, so put them back */
        for (i=0; i<gv->nsecs; i++) {
          while (rel = (struct Reloc *)remhead(rlist[i]))
            addtail(&sec->relocs,&rel->n);
        }
        goto free_rlists;
      }
      if (!gv->dest_object && relhunk==HUNK_ABSRELOC32)
        relhunk = HUNK_DREL32;
      fwrite32be(f,relhunk);  /* reloc hunk id */

      for (i=0; i<gv->nsecs; i++) {
        if (rcnt[i]) {
          fwrite16be(f,(uint16_t)rcnt[i]);  /* number of relocations */
          fwrite16be(f,(uint16_t)i);  /* section index */
          cnt += 2;

          /* store relocation offsets */
          while (rel = (struct Reloc *)remhead(rlist[i])) {
            fwrite16be(f,(uint16_t)rel->offset);
            cnt++;
          }
        }
      }
      /* no more relocation entries */
      if (cnt & 1)  /* 0-word for 32-bit alignment */
        fwrite16be(f,0);
      else
        fwrite32be(f,0);
    }

    else {
      /* all other relocation hunks */
      fwrite32be(f,relhunk);  /* reloc hunk id */
      for (i=0; i<gv->nsecs; i++) {
        while (rcnt[i]) {
          /* never write more than 65536 relocs at once - there is a bug */
          /* in dos.library which rejects the executable file otherwise */
          int n = (rcnt[i]>0x10000) ? 0x10000 : rcnt[i];

          fwrite32be(f,(uint32_t)n);  /* number of relocations */
          fwrite32be(f,(uint32_t)i);  /* section index */
          rcnt[i] -= n;

          /* store relocation offsets */
          while (n--) {
            if (rel = (struct Reloc *)remhead(rlist[i])) {
              fwrite32be(f,(uint32_t)rel->offset);
            }
          }
        }
      }
      fwrite32be(f,0);  /* no more relocation entries */
    }
  }

  free_rlists:
  /* free dynamically allocated rlists and rcnt array */
  for (i=0; i<gv->nsecs; free(rlist[i++]));
  free(rcnt);
}